

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

void ComputerThink(Situation *situation)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 unaff_EBP;
  ulong unaff_R12;
  int depth;
  byte bVar6;
  ulong unaff_R15;
  Movement MVar7;
  int move_num;
  Situation *local_840;
  ofstream f;
  Movement move_list [128];
  
  isTimeLimit = false;
  step = 0;
  ResetHashTable();
  ResetHistory();
  StartTime = clock();
  if (situation->UseBook == true) {
    MVar7 = ReadBookTable(situation);
    if ((MVar7.from != '\0') &&
       (bVar3 = MovementsLegal(MVar7,situation), unaff_EBP = MVar7._8_4_, bVar3)) {
      MovementToStr_abi_cxx11_((string *)move_list,MVar7);
      printf("bestmove %s\n",move_list[0]._0_8_);
      std::__cxx11::string::~string((string *)move_list);
      fflush(_stdout);
      return;
    }
  }
  move_num = 0;
  InitRootMove(situation,&move_num,move_list);
  if (move_num == 1) {
    bVar6 = SUB81(move_list[0]._0_8_,1);
    situation = (Situation *)((ulong)move_list[0]._0_8_ >> 0x10);
    unaff_R12 = move_list[0]._0_8_;
    unaff_EBP = move_list[0]._8_4_;
  }
  else {
    depth = 1;
    local_840 = situation;
    do {
      bVar6 = (byte)unaff_R15;
      if ((depth == 0x19) ||
         (NowMaxDepth = depth, iVar4 = SearchRoot(local_840,depth,move_list,move_num),
         uVar2 = BestMove._8_4_, uVar1 = BestMove._0_8_, isTimeLimit != false)) break;
      debug_value = iVar4;
      std::ofstream::ofstream((ostream *)&f);
      std::ofstream::open((char *)&f,0x10e295);
      poVar5 = std::operator<<((ostream *)&f,"Depth: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,depth);
      poVar5 = std::operator<<(poVar5," Time: ");
      clock();
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::operator<<(poVar5,"ms \n");
      std::ofstream::close();
      unaff_R15 = (ulong)uVar1 >> 8 & 0xffffff;
      bVar6 = (byte)unaff_R15;
      situation = (Situation *)((ulong)uVar1 >> 0x10);
      std::ofstream::~ofstream((ostream *)&f);
      depth = depth + 1;
      unaff_R12 = uVar1;
      unaff_EBP = uVar2;
    } while (iVar4 < 0x26f9);
  }
  if ((byte)unaff_R12 == bVar6) {
    puts("nobestmove");
  }
  else {
    MVar7._0_8_ = unaff_R12 & 0xff | (ulong)bVar6 << 8 | (long)situation << 0x10;
    MVar7.catc = (UINT8)unaff_EBP;
    MVar7.movec = SUB41(unaff_EBP,1);
    MVar7._10_2_ = SUB42(unaff_EBP,2);
    MovementToStr_abi_cxx11_((string *)&f,MVar7);
    printf("bestmove %s\n",_f);
    std::__cxx11::string::~string((string *)&f);
  }
  fflush(_stdout);
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,0x10e295);
  poVar5 = std::operator<<((ostream *)&f,"Bestmove\'s value: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,debug_value);
  std::operator<<(poVar5,'\n');
  std::operator<<((ostream *)&f,"=========================================\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void ComputerThink(Situation& situation){
    int value, max_depth;
    Movement best_move_save;
    isTimeLimit = false;
    step = 0;
    ResetHashTable();   // 清空置换表
    ResetHistory();     // 清空历史表和杀手表
    StartTime = clock();

    // 读取开局库
    if(situation.UseBook){
        Movement book_move = ReadBookTable(situation);
        if(book_move.from != 0 && MovementsLegal(book_move, situation)){
            printf ("bestmove %s\n", MovementToStr(book_move).c_str());
		    fflush (stdout);
            return;
        }
    }

    Movement move_list[128];            // 当前所有着法
    int move_num = 0;
    InitRootMove(situation, move_num, move_list);
    // 唯一着法，不必搜索直接返回
    if(move_num == 1){
        best_move_save = move_list[0];
    }
    else{
        // 迭代加深搜索
        for(max_depth = 1; max_depth <= MAX_DEPTH; max_depth++){
            NowMaxDepth = max_depth;
            value = SearchRoot(situation, max_depth, move_list, move_num);
            if(isTimeLimit){
                break;
            }
            else{
                best_move_save = BestMove;
                debug_value = value;
                // 输出日志文件(每层搜索结果)
                std::ofstream f;
                f.open("debug.log", std::ios::app | std::ios::out);
                f << "Depth: " << max_depth << " Time: " << clock() - StartTime << "ms \n";
                f.close();
            }
            if(value > WIN_VALUE) break;
        }
    }


    // 必败 认输
    if(best_move_save.from == best_move_save.to){
        printf ( "nobestmove\n" ); // 认输
		fflush (stdout);
    }
    // 输出最优着法
    else{
        printf ("bestmove %s\n", MovementToStr(best_move_save).c_str());
		fflush (stdout);
    }

    // 输出日志文件(返回最佳着法)
    std::ofstream f;
    f.open("debug.log", std::ios::app | std::ios::out);
    f << "Bestmove's value: " << debug_value << '\n';
    f << "=========================================\n";
    f.close();
    return;
}